

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  
  puts("REPEAT_CB");
  if (handle == (uv_timer_t *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)handle);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close((uv_handle_t *)handle,repeat_close_cb);
        return;
      }
      return;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,0x6f,"never_cb should never be called",in_R9,handle);
  fflush(_stderr);
  abort();
}

Assistant:

static void repeat_cb(uv_timer_t* handle) {
  printf("REPEAT_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_EQ(1, uv_is_active((uv_handle_t*) handle));

  repeat_cb_called++;

  if (repeat_cb_called == 5) {
    uv_close((uv_handle_t*)handle, repeat_close_cb);
  }
}